

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenRefCast(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenType type)

{
  RefCast *pRVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pRVar1 = wasm::Builder::makeRefCast(&local_10,ref,(Type)type);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefCast(BinaryenModuleRef module,
                                      BinaryenExpressionRef ref,
                                      BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefCast((Expression*)ref, Type(type)));
}